

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_perm_c.c
# Opt level: O1

void getata(int m,int n,int_t nz,int_t *colptr,int_t *rowind,int_t *atanz,int_t **ata_colptr,
           int_t **ata_rowind)

{
  int *piVar1;
  int iVar2;
  int_t *piVar3;
  int iVar4;
  void *__s;
  undefined4 *addr;
  void *addr_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int_t *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  char msg [256];
  char local_138 [264];
  
  iVar4 = n;
  if (n < m) {
    iVar4 = m;
  }
  __s = superlu_malloc((long)iVar4 * 4 + 4);
  if (__s == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xa2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  addr = (undefined4 *)superlu_malloc((long)m * 4 + 4);
  if (addr == (undefined4 *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xa4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  addr_00 = superlu_malloc((long)nz << 2);
  if (addr_00 == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xa6,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  if (0 < m) {
    memset(__s,0,(ulong)(uint)m * 4);
  }
  uVar5 = (ulong)(uint)n;
  if (0 < n) {
    uVar7 = 0;
    do {
      lVar9 = (long)colptr[uVar7];
      uVar6 = uVar7 + 1;
      if (colptr[uVar7] < colptr[uVar7 + 1]) {
        do {
          piVar1 = (int *)((long)__s + (long)rowind[lVar9] * 4);
          *piVar1 = *piVar1 + 1;
          lVar9 = lVar9 + 1;
        } while (lVar9 < colptr[uVar6]);
      }
      uVar7 = uVar6;
    } while (uVar6 != uVar5);
  }
  *addr = 0;
  if (0 < m) {
    uVar7 = 0;
    do {
      addr[uVar7 + 1] = *(int *)((long)__s + uVar7 * 4) + addr[uVar7];
      *(undefined4 *)((long)__s + uVar7 * 4) = addr[uVar7];
      uVar7 = uVar7 + 1;
    } while ((uint)m != uVar7);
  }
  if (0 < n) {
    uVar7 = 0;
    do {
      lVar9 = (long)colptr[uVar7];
      uVar6 = uVar7 + 1;
      if (colptr[uVar7] < colptr[uVar7 + 1]) {
        do {
          iVar4 = rowind[lVar9];
          *(int *)((long)addr_00 + (long)*(int *)((long)__s + (long)iVar4 * 4) * 4) = (int)uVar7;
          piVar1 = (int *)((long)__s + (long)iVar4 * 4);
          *piVar1 = *piVar1 + 1;
          lVar9 = lVar9 + 1;
        } while (lVar9 < colptr[uVar6]);
      }
      uVar7 = uVar6;
    } while (uVar6 != uVar5);
  }
  if (n < 1) {
    iVar4 = 0;
  }
  else {
    memset(__s,0xff,uVar5 * 4);
    iVar4 = 0;
    uVar7 = 0;
    do {
      *(int *)((long)__s + uVar7 * 4) = (int)uVar7;
      lVar9 = (long)colptr[uVar7];
      uVar6 = uVar7 + 1;
      if (colptr[uVar7] < colptr[uVar7 + 1]) {
        do {
          lVar10 = (long)rowind[lVar9];
          lVar11 = (long)(int)addr[lVar10];
          if ((int)addr[lVar10] < (int)addr[lVar10 + 1]) {
            do {
              lVar12 = (long)*(int *)((long)addr_00 + lVar11 * 4);
              if (uVar7 != *(uint *)((long)__s + lVar12 * 4)) {
                *(int *)((long)__s + lVar12 * 4) = (int)uVar7;
                iVar4 = iVar4 + 1;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < (int)addr[lVar10 + 1]);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < colptr[uVar6]);
      }
      uVar7 = uVar6;
    } while (uVar6 != uVar5);
  }
  *atanz = iVar4;
  piVar8 = (int_t *)superlu_malloc((long)n * 4 + 4);
  *ata_colptr = piVar8;
  if (piVar8 == (int_t *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ata_colptr[]",0xe4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  if ((long)*atanz != 0) {
    piVar8 = (int_t *)superlu_malloc((long)*atanz << 2);
    *ata_rowind = piVar8;
    if (piVar8 == (int_t *)0x0) {
      sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ata_rowind[]",0xe7,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit(local_138);
    }
  }
  piVar8 = *ata_colptr;
  piVar3 = *ata_rowind;
  if (n < 1) {
    iVar4 = 0;
  }
  else {
    memset(__s,0xff,uVar5 * 4);
    iVar4 = 0;
    uVar7 = 0;
    do {
      piVar8[uVar7] = iVar4;
      *(int *)((long)__s + uVar7 * 4) = (int)uVar7;
      lVar9 = (long)colptr[uVar7];
      uVar6 = uVar7 + 1;
      if (colptr[uVar7] < colptr[uVar7 + 1]) {
        do {
          lVar10 = (long)rowind[lVar9];
          lVar11 = (long)(int)addr[lVar10];
          if ((int)addr[lVar10] < (int)addr[lVar10 + 1]) {
            do {
              iVar2 = *(int *)((long)addr_00 + lVar11 * 4);
              if (uVar7 != *(uint *)((long)__s + (long)iVar2 * 4)) {
                *(int *)((long)__s + (long)iVar2 * 4) = (int)uVar7;
                lVar12 = (long)iVar4;
                iVar4 = iVar4 + 1;
                piVar3[lVar12] = iVar2;
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < (int)addr[lVar10 + 1]);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < colptr[uVar6]);
      }
      uVar7 = uVar6;
    } while (uVar6 != uVar5);
  }
  piVar8[n] = iVar4;
  superlu_free(__s);
  superlu_free(addr);
  superlu_free(addr_00);
  return;
}

Assistant:

void getata(const int m, const int n, const int_t nz, const int_t *colptr, const int_t *rowind,
            int_t *atanz, int_t **ata_colptr, int_t **ata_rowind)
{
    register int_t i, j, k, col, num_nz, ti, trow;
    int_t *marker, *b_colptr, *b_rowind;
    int_t *t_colptr, *t_rowind; /* a column oriented form of T = A' */

    if ( !(marker = (int_t*) SUPERLU_MALLOC((SUPERLU_MAX(m,n)+1)*sizeof(int_t))) )
	ABORT("SUPERLU_MALLOC fails for marker[]");
    if ( !(t_colptr = (int_t*) SUPERLU_MALLOC((m+1) * sizeof(int_t))) )
	ABORT("SUPERLU_MALLOC t_colptr[]");
    if ( !(t_rowind = (int_t*) SUPERLU_MALLOC(nz * sizeof(int_t))) )
	ABORT("SUPERLU_MALLOC fails for t_rowind[]");

    
    /* Get counts of each column of T, and set up column pointers */
    for (i = 0; i < m; ++i) marker[i] = 0;
    for (j = 0; j < n; ++j) {
	for (i = colptr[j]; i < colptr[j+1]; ++i)
	    ++marker[rowind[i]];
    }
    t_colptr[0] = 0;
    for (i = 0; i < m; ++i) {
	t_colptr[i+1] = t_colptr[i] + marker[i];
	marker[i] = t_colptr[i];
    }

    /* Transpose the matrix from A to T */
    for (j = 0; j < n; ++j)
	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    col = rowind[i];
	    t_rowind[marker[col]] = j;
	    ++marker[col];
	}

    
    /* ----------------------------------------------------------------
       compute B = T * A, where column j of B is:

       Struct (B_*j) =    UNION   ( Struct (T_*k) )
                        A_kj != 0

       do not include the diagonal entry
   
       ( Partition A as: A = (A_*1, ..., A_*n)
         Then B = T * A = (T * A_*1, ..., T * A_*n), where
         T * A_*j = (T_*1, ..., T_*m) * A_*j.  )
       ---------------------------------------------------------------- */

    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;

    /* First pass determines number of nonzeros in B */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    /* A_kj is nonzero, add pattern of column T_*k to B_*j */
	    k = rowind[i];
	    for (ti = t_colptr[k]; ti < t_colptr[k+1]; ++ti) {
		trow = t_rowind[ti];
		if ( marker[trow] != j ) {
		    marker[trow] = j;
		    num_nz++;
		}
	    }
	}
    }
    *atanz = num_nz;
    
    /* Allocate storage for A'*A */
    if ( !(*ata_colptr = (int_t*) SUPERLU_MALLOC( (n+1) * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for ata_colptr[]");
    if ( *atanz ) {
	if ( !(*ata_rowind = (int_t*) SUPERLU_MALLOC( *atanz * sizeof(int_t)) ) )
	    ABORT("SUPERLU_MALLOC fails for ata_rowind[]");
    }
    b_colptr = *ata_colptr; /* aliasing */
    b_rowind = *ata_rowind;
    
    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;
    
    /* Compute each column of B, one at a time */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	b_colptr[j] = num_nz;
	
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    /* A_kj is nonzero, add pattern of column T_*k to B_*j */
	    k = rowind[i];
	    for (ti = t_colptr[k]; ti < t_colptr[k+1]; ++ti) {
		trow = t_rowind[ti];
		if ( marker[trow] != j ) {
		    marker[trow] = j;
		    b_rowind[num_nz++] = trow;
		}
	    }
	}
    }
    b_colptr[n] = num_nz;
       
    SUPERLU_FREE(marker);
    SUPERLU_FREE(t_colptr);
    SUPERLU_FREE(t_rowind);
}